

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

Abc_Obj_t * Abc_ObjInsertBetween(Abc_Obj_t *pNodeIn,Abc_Obj_t *pNodeOut,Abc_ObjType_t Type)

{
  int i;
  int i_00;
  char *pcVar1;
  int iFaninIndex;
  int iFanoutIndex;
  Abc_Obj_t *pNodeNew;
  Abc_ObjType_t Type_local;
  Abc_Obj_t *pNodeOut_local;
  Abc_Obj_t *pNodeIn_local;
  
  i = Vec_IntFind(&pNodeIn->vFanouts,pNodeOut->Id);
  if (i == -1) {
    pcVar1 = Abc_ObjName(pNodeOut);
    printf("Node %s is not among",pcVar1);
    pcVar1 = Abc_ObjName(pNodeIn);
    printf(" the fanouts of node %s...\n",pcVar1);
    pNodeIn_local = (Abc_Obj_t *)0x0;
  }
  else {
    i_00 = Vec_IntFind(&pNodeOut->vFanins,pNodeIn->Id);
    if (i_00 == -1) {
      pcVar1 = Abc_ObjName(pNodeIn);
      printf("Node %s is not among",pcVar1);
      pcVar1 = Abc_ObjName(pNodeOut);
      printf(" the fanins of node %s...\n",pcVar1);
      pNodeIn_local = (Abc_Obj_t *)0x0;
    }
    else {
      pNodeIn_local = Abc_NtkCreateObj(pNodeIn->pNtk,Type);
      Vec_IntPushMem(pNodeIn_local->pNtk->pMmStep,&pNodeIn_local->vFanins,pNodeIn->Id);
      Vec_IntPushMem(pNodeIn_local->pNtk->pMmStep,&pNodeIn_local->vFanouts,pNodeOut->Id);
      Vec_IntWriteEntry(&pNodeIn->vFanouts,i,pNodeIn_local->Id);
      Vec_IntWriteEntry(&pNodeOut->vFanins,i_00,pNodeIn_local->Id);
    }
  }
  return pNodeIn_local;
}

Assistant:

Abc_Obj_t * Abc_ObjInsertBetween( Abc_Obj_t * pNodeIn, Abc_Obj_t * pNodeOut, Abc_ObjType_t Type )
{
    Abc_Obj_t * pNodeNew;
    int iFanoutIndex, iFaninIndex;
    // find pNodeOut among the fanouts of pNodeIn
    if ( (iFanoutIndex = Vec_IntFind( &pNodeIn->vFanouts, pNodeOut->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeOut) );
        printf( " the fanouts of node %s...\n", Abc_ObjName(pNodeIn) );
        return NULL;
    }
    // find pNodeIn among the fanins of pNodeOut
    if ( (iFaninIndex = Vec_IntFind( &pNodeOut->vFanins, pNodeIn->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeIn) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pNodeOut) );
        return NULL;
    }
    // create the new node
    pNodeNew = Abc_NtkCreateObj( pNodeIn->pNtk, Type );
    // add pNodeIn as fanin and pNodeOut as fanout
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanins,  pNodeIn->Id  );
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanouts, pNodeOut->Id );
    // update the fanout of pNodeIn
    Vec_IntWriteEntry( &pNodeIn->vFanouts, iFanoutIndex, pNodeNew->Id );
    // update the fanin of pNodeOut
    Vec_IntWriteEntry( &pNodeOut->vFanins, iFaninIndex, pNodeNew->Id );
    return pNodeNew;
}